

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

void __thiscall ObjectIdentifier::SetValue(ObjectIdentifier *this,char *szOid)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  pointer puVar1;
  unsigned_long uVar2;
  bool bVar3;
  invalid_argument *this_00;
  ObjectIdentifier *pOVar4;
  uchar local_58 [8];
  uchar buf [8];
  unsigned_long second;
  unsigned_long first;
  char *next;
  size_t cbUsed;
  
  puVar1 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  first = 0;
  next = (char *)0x0;
  pOVar4 = this;
  GetNextLong(this,szOid,(char **)&first,&second);
  uVar2 = second;
  if ((first != 0) && (second < 3)) {
    value = &this->value;
    GetNextLong(pOVar4,(char *)first,(char **)&first,(unsigned_long *)buf);
    EncodeLong(pOVar4,uVar2 * 0x28 + (long)buf,local_58,8,(size_t *)&next);
    pOVar4 = (ObjectIdentifier *)value;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)value,
               (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,local_58,next + (long)local_58);
    if (first != 0) {
      do {
        GetNextLong(pOVar4,(char *)first,(char **)&first,&second);
        EncodeLong(pOVar4,second,local_58,8,(size_t *)&next);
        pOVar4 = (ObjectIdentifier *)value;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)value,
                   (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_58,next + (long)local_58);
      } while (first != 0);
    }
    bVar3 = GetOidInfoIndex(value,&this->oidIndex);
    if (!bVar3) {
      this->oidIndex = 0xffffffffffffffff;
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Illegal OID");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ObjectIdentifier::SetValue(const char * szOid)
{
	/*
	Current encoding practice is to multiply the first number by 40, then add the second.
	Practically, anything we care about with respect to crypto starts with 1.

	But let's try to make a general purpose library where we can, so there are the following:
	0, followed by 0-5 as possible values
	1, followed by 0-3
	2, followed by 0-51, with 999 used as an example

	We can then tell which of the three cases we have like so:
	0 - the value is < 40
	1 - value is < 80 and >= 40
	2 - value is >= 80

	*/
	value.clear();

	// This is going to require a substantial parser
	const char* tmp = szOid;
	unsigned long first, second;
	const char* next = nullptr;
	unsigned char buf[8];
	size_t cbUsed = 0;

	// The first two are special
	GetNextLong(tmp, next, first);

	if (next == nullptr || first > 2)
		throw std::invalid_argument("Illegal OID");

	tmp = next;
	GetNextLong(tmp, next, second);

	EncodeLong(first * 40 + second, buf, sizeof(buf), cbUsed);

	value.insert(value.begin(), buf, buf + cbUsed);

	// Now keep going to get the rest of the OID
	while (next != nullptr)
	{
		tmp = next;
		GetNextLong(tmp, next, first);
		EncodeLong(first, buf, sizeof(buf), cbUsed);
		value.insert(value.end(), buf, buf + cbUsed);
	}

    SetOidIndex();
}